

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCDOrderParameter.cpp
# Opt level: O3

void __thiscall OpenMD::SCDOrderParameter::process(SCDOrderParameter *this)

{
  pointer pSVar1;
  pointer pdVar2;
  int iVar3;
  pointer pSVar4;
  long lVar5;
  pointer pSVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  RealType RVar10;
  DumpReader reader;
  DumpReader DStack_1288;
  
  DumpReader::DumpReader
            (&DStack_1288,(this->super_StaticAnalyser).info_,
             &(this->super_StaticAnalyser).dumpFilename_);
  iVar3 = DumpReader::getNFrames(&DStack_1288);
  if (iVar3 < 1) {
    pSVar6 = (this->scdElems_).super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = (this->scdElems_).super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    iVar9 = 0;
    do {
      DumpReader::readFrame(&DStack_1288,iVar9);
      pSVar1 = (this->scdElems_).
               super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>._M_impl.
               super__Vector_impl_data._M_start;
      this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      pSVar4 = (this->scdElems_).
               super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pSVar6 = pSVar4;
      if (pSVar4 != pSVar1) {
        lVar7 = 0;
        uVar8 = 0;
        pSVar6 = pSVar1;
        do {
          RVar10 = SCDElem::calcSCD((SCDElem *)((long)&(pSVar6->sele1_)._M_dataplus._M_p + lVar7),
                                    this->currentSnapshot_);
          pdVar2 = (this->scdParam_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar2[uVar8] = RVar10 + pdVar2[uVar8];
          uVar8 = uVar8 + 1;
          pSVar6 = (this->scdElems_).
                   super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pSVar4 = (this->scdElems_).
                   super__Vector_base<OpenMD::SCDElem,_std::allocator<OpenMD::SCDElem>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          lVar7 = lVar7 + 0x80;
        } while (uVar8 < (ulong)((long)pSVar4 - (long)pSVar6 >> 7));
      }
      iVar9 = iVar9 + (this->super_StaticAnalyser).step_;
    } while (iVar9 < iVar3);
  }
  if ((long)pSVar4 - (long)pSVar6 != 0) {
    lVar7 = (long)pSVar4 - (long)pSVar6 >> 7;
    iVar9 = (this->super_StaticAnalyser).step_;
    pdVar2 = (this->scdParam_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      pdVar2[lVar5] = pdVar2[lVar5] / (double)(iVar3 / iVar9);
      lVar5 = lVar5 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != lVar5);
  }
  writeSCD(this);
  DumpReader::~DumpReader(&DStack_1288);
  return;
}

Assistant:

void SCDOrderParameter::process() {
    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    for (int i = 0; i < nFrames; i += step_) {
      reader.readFrame(i);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (std::size_t j = 0; j < scdElems_.size(); ++j) {
        scdParam_[j] += scdElems_[j].calcSCD(currentSnapshot_);
      }
    }

    int nProcessed = nFrames / step_;
    for (std::size_t j = 0; j < scdElems_.size(); ++j) {
      scdParam_[j] /= nProcessed;
    }

    writeSCD();
  }